

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.cpp
# Opt level: O1

int __thiscall
zmq::socks_auth_response_decoder_t::input(socks_auth_response_decoder_t *this,fd_t fd_)

{
  uint uVar1;
  
  if (1 < this->_bytes_read) {
    input();
  }
  uVar1 = tcp_read(fd_,this->_buf + this->_bytes_read,2 - this->_bytes_read);
  if ((0 < (int)uVar1) &&
     (this->_bytes_read = this->_bytes_read + (ulong)uVar1, this->_buf[0] != '\x01')) {
    return -1;
  }
  return uVar1;
}

Assistant:

int zmq::socks_auth_response_decoder_t::input (fd_t fd_)
{
    zmq_assert (_bytes_read < 2);
    const int rc = tcp_read (fd_, _buf + _bytes_read, 2 - _bytes_read);
    if (rc > 0) {
        _bytes_read += static_cast<size_t> (rc);
        if (_buf[0] != 0x01)
            return -1;
    }
    return rc;
}